

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O3

void TMS320C64x_post_printer(csh ud,cs_insn *insn,char *insn_asm,MCInst *mci)

{
  uint8_t uVar1;
  cs_detail *pcVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  char *__s;
  bool bVar8;
  char tmp [8];
  SStream ss;
  undefined2 local_22c;
  undefined1 local_22a;
  SStream local_224;
  
  if (mci->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar2 = mci->flat_insn->detail;
  uVar5 = (ulong)insn->detail->groups_count;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      uVar1 = insn->detail->groups[uVar6];
      if ((char)uVar1 < -0x7b) {
        uVar3 = (uint)(byte)(uVar1 + 0x81);
        goto LAB_0026568f;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  uVar3 = 0;
LAB_0026568f:
  *(uint *)&(pcVar2->field_6).x86.operands[4].field_0x4 = uVar3;
  SStream_Init(&local_224);
  uVar3 = (pcVar2->field_6).tms320c64x.condition.reg;
  if (uVar3 == 0) {
    SStream_concat0(&local_224,"||||||");
  }
  else {
    uVar7 = 0x7c;
    if ((pcVar2->field_6).x86.operands[4].type == X86_OP_REG) {
      uVar7 = 0x21;
    }
    pcVar4 = cs_reg_name(ud,uVar3);
    SStream_concat(&local_224,"[%c%s]|",(ulong)uVar7,pcVar4);
  }
  pcVar4 = strchr(insn_asm,9);
  bVar8 = pcVar4 == (char *)0x0;
  if (bVar8) {
    SStream_concat0(&local_224,insn_asm);
    __s = (char *)0x0;
  }
  else {
    __s = pcVar4 + 1;
    *pcVar4 = '\0';
    SStream_concat0(&local_224,insn_asm);
    pcVar4 = strchr(__s,0x5b);
    if ((pcVar4 != (char *)0x0) || (pcVar4 = strchr(__s,0x28), pcVar4 != (char *)0x0)) {
      for (; (__s < pcVar4 && (1 < (byte)(*pcVar4 + 0x9fU))); pcVar4 = pcVar4 + -1) {
      }
      if (pcVar4 == __s) {
        builtin_strncpy(insn_asm,"Invalid!",9);
        return;
      }
      if (*pcVar4 == 'a') {
        local_22c = 0x5431;
      }
      else {
        local_22c = 0x5432;
      }
      local_22a = 0;
      bVar8 = false;
      goto LAB_002657aa;
    }
  }
  local_22c = (ushort)local_22c._1_1_ << 8;
LAB_002657aa:
  uVar3 = *(int *)&(pcVar2->field_6).x86.operands[4].field_0x4 - 1;
  if (uVar3 < 4) {
    SStream_concat(&local_224,&DAT_005883e4 + *(int *)(&DAT_005883e4 + (ulong)uVar3 * 4),&local_22c,
                   (ulong)(pcVar2->field_6).x86.operands[4].field_1.reg);
  }
  if ((pcVar2->field_6).x86.operands[4].field_1.mem.base != X86_REG_INVALID) {
    SStream_concat0(&local_224,"X");
  }
  if (!bVar8) {
    SStream_concat(&local_224,"\t%s",__s);
  }
  if ((pcVar2->field_6).x86.operands[4].field_1.mem.index != X86_REG_INVALID) {
    SStream_concat(&local_224,"\t||");
  }
  strcpy(insn_asm,local_224.buffer);
  return;
}

Assistant:

void TMS320C64x_post_printer(csh ud, cs_insn *insn, char *insn_asm, MCInst *mci)
{
	SStream ss;
	char *p, *p2, tmp[8];
	unsigned int unit = 0;
	int i;
	cs_tms320c64x *tms320c64x;

	if (mci->csh->detail) {
		tms320c64x = &mci->flat_insn->detail->tms320c64x;

		for (i = 0; i < insn->detail->groups_count; i++) {
			switch(insn->detail->groups[i]) {
				case TMS320C64X_GRP_FUNIT_D:
					unit = TMS320C64X_FUNIT_D;
					break;
				case TMS320C64X_GRP_FUNIT_L:
					unit = TMS320C64X_FUNIT_L;
					break;
				case TMS320C64X_GRP_FUNIT_M:
					unit = TMS320C64X_FUNIT_M;
					break;
				case TMS320C64X_GRP_FUNIT_S:
					unit = TMS320C64X_FUNIT_S;
					break;
				case TMS320C64X_GRP_FUNIT_NO:
					unit = TMS320C64X_FUNIT_NO;
					break;
			}
			if (unit != 0)
				break;
		}
		tms320c64x->funit.unit = unit;

		SStream_Init(&ss);
		if (tms320c64x->condition.reg != TMS320C64X_REG_INVALID)
			SStream_concat(&ss, "[%c%s]|", (tms320c64x->condition.zero == 1) ? '!' : '|', cs_reg_name(ud, tms320c64x->condition.reg));
		else
			SStream_concat0(&ss, "||||||");

		p = strchr(insn_asm, '\t');
		if (p != NULL)
			*p++ = '\0';

		SStream_concat0(&ss, insn_asm);
		if ((p != NULL) && (((p2 = strchr(p, '[')) != NULL) || ((p2 = strchr(p, '(')) != NULL))) {
			while ((p2 > p) && ((*p2 != 'a') && (*p2 != 'b')))
				p2--;
			if (p2 == p) {
				strcpy(insn_asm, "Invalid!");
				return;
			}
			if (*p2 == 'a')
				strcpy(tmp, "1T");
			else
				strcpy(tmp, "2T");
		} else {
			tmp[0] = '\0';
		}
		switch(tms320c64x->funit.unit) {
			case TMS320C64X_FUNIT_D:
				SStream_concat(&ss, ".D%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_L:
				SStream_concat(&ss, ".L%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_M:
				SStream_concat(&ss, ".M%s%u", tmp, tms320c64x->funit.side);
				break;
			case TMS320C64X_FUNIT_S:
				SStream_concat(&ss, ".S%s%u", tmp, tms320c64x->funit.side);
				break;
		}
		if (tms320c64x->funit.crosspath > 0)
			SStream_concat0(&ss, "X");

		if (p != NULL)
			SStream_concat(&ss, "\t%s", p);

		if (tms320c64x->parallel != 0)
			SStream_concat(&ss, "\t||");

		/* insn_asm is a buffer from an SStream, so there should be enough space */
		strcpy(insn_asm, ss.buffer);
	}
}